

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSet::applyPropertyPattern
          (UnicodeSet *this,RuleCharacterIterator *chars,UnicodeString *rebuiltPat,UErrorCode *ec)

{
  UBool UVar1;
  int32_t iVar2;
  undefined1 local_88 [8];
  ParsePosition pos;
  undefined1 local_68 [8];
  UnicodeString pattern;
  UErrorCode *ec_local;
  UnicodeString *rebuiltPat_local;
  RuleCharacterIterator *chars_local;
  UnicodeSet *this_local;
  
  pattern.fUnion._48_8_ = ec;
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_68);
    RuleCharacterIterator::lookahead(chars,(UnicodeString *)local_68,-1);
    ParsePosition::ParsePosition((ParsePosition *)local_88,0);
    applyPropertyPattern
              (this,(UnicodeString *)local_68,(ParsePosition *)local_88,
               (UErrorCode *)pattern.fUnion._48_8_);
    UVar1 = ::U_FAILURE(*(UErrorCode *)pattern.fUnion._48_8_);
    if (UVar1 == '\0') {
      iVar2 = ParsePosition::getIndex((ParsePosition *)local_88);
      if (iVar2 == 0) {
        *(undefined4 *)pattern.fUnion._48_8_ = 0x10002;
      }
      else {
        iVar2 = ParsePosition::getIndex((ParsePosition *)local_88);
        RuleCharacterIterator::jumpahead(chars,iVar2);
        iVar2 = ParsePosition::getIndex((ParsePosition *)local_88);
        icu_63::UnicodeString::append(rebuiltPat,(UnicodeString *)local_68,0,iVar2);
      }
    }
    ParsePosition::~ParsePosition((ParsePosition *)local_88);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_68);
  }
  return;
}

Assistant:

void UnicodeSet::applyPropertyPattern(RuleCharacterIterator& chars,
                                      UnicodeString& rebuiltPat,
                                      UErrorCode& ec) {
    if (U_FAILURE(ec)) return;
    UnicodeString pattern;
    chars.lookahead(pattern);
    ParsePosition pos(0);
    applyPropertyPattern(pattern, pos, ec);
    if (U_FAILURE(ec)) return;
    if (pos.getIndex() == 0) {
        // syntaxError(chars, "Invalid property pattern");
        ec = U_MALFORMED_SET;
        return;
    }
    chars.jumpahead(pos.getIndex());
    rebuiltPat.append(pattern, 0, pos.getIndex());
}